

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.hpp
# Opt level: O2

void diy::
     Serialization<std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>_>::
     load(BinaryBuffer *bb,Vector *v)

{
  size_t __new_size;
  size_t s;
  Point<float,_3U> local_34;
  
  (*bb->_vptr_BinaryBuffer[4])(bb,&s,8);
  __new_size = s;
  Point<float,_3U>::Point(&local_34);
  std::vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>::resize
            (v,__new_size,&local_34);
  if (s != 0) {
    (*bb->_vptr_BinaryBuffer[4])
              (bb,(v->
                  super__Vector_base<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_>
                  )._M_impl.super__Vector_impl_data._M_start,s * 0xc);
  }
  return;
}

Assistant:

static void         load(BinaryBuffer& bb, Vector& v)
    {
      size_t s;
      diy::load(bb, s);
      v.resize(s, U());
      if (s > 0)
        diy::load(bb, &v[0], s);
    }